

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall embree::TokenStream::tryString(TokenStream *this,Token *token,ParseLocation *loc)

{
  int iVar1;
  Stream<int> *this_00;
  uint uVar2;
  int *piVar3;
  runtime_error *this_01;
  string str;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Token local_78;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  piVar3 = Stream<int>::peek((this->cin).ptr);
  iVar1 = *piVar3;
  if (iVar1 == 0x22) {
    Stream<int>::drop((this->cin).ptr);
    while( true ) {
      piVar3 = Stream<int>::peek((this->cin).ptr);
      this_00 = (this->cin).ptr;
      if (*piVar3 == 0x22) break;
      uVar2 = Stream<int>::get(this_00);
      if ((0xff < uVar2) || (this->isStringCharMap[uVar2] == false)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_f8,'\x01');
        std::operator+(&local_b8,"invalid string character ",&local_f8);
        std::operator+(&local_98,&local_b8," at ");
        ParseLocation::str_abi_cxx11_(&local_d8,loc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_78,&local_98,&local_d8);
        std::runtime_error::runtime_error(this_01,(string *)&local_78);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::push_back((char)&str);
    }
    Stream<int>::drop(this_00);
    std::__cxx11::string::string((string *)&local_118,(string *)&str);
    Token::Token(&local_78,&local_118,TY_STRING,loc);
    Token::operator=(token,&local_78);
    Token::~Token(&local_78);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::string::~string((string *)&str);
  return iVar1 == 0x22;
}

Assistant:

bool TokenStream::tryString(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (cin->peek() != '\"') return false;
    cin->drop();
    while (cin->peek() != '\"') {
      const int c = cin->get();
      if (!isStringChar(c)) THROW_RUNTIME_ERROR("invalid string character "+std::string(1,c)+" at "+loc.str());
      str += (char)c;
    }
    cin->drop();
    token = Token(str,Token::TY_STRING,loc);
    return true;
  }